

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void PatchDistanceCodesForBuggyDecoders(uint *d_lengths)

{
  long lVar1;
  uint uVar2;
  
  lVar1 = 0;
  uVar2 = 0;
  do {
    if (lVar1 == 0x1e) {
      if (uVar2 == 0) {
        d_lengths[1] = 1;
      }
      else {
        d_lengths = d_lengths + (*d_lengths != 0);
      }
      *d_lengths = 1;
      return;
    }
    uVar2 = (uVar2 + 1) - (uint)(d_lengths[lVar1] == 0);
    lVar1 = lVar1 + 1;
  } while (uVar2 < 2);
  return;
}

Assistant:

static void PatchDistanceCodesForBuggyDecoders(unsigned* d_lengths) {
  int num_dist_codes = 0; /* Amount of non-zero distance codes */
  int i;
  for (i = 0; i < 30 /* Ignore the two unused codes from the spec */; i++) {
    if (d_lengths[i]) num_dist_codes++;
    if (num_dist_codes >= 2) return; /* Two or more codes is fine. */
  }

  if (num_dist_codes == 0) {
    d_lengths[0] = d_lengths[1] = 1;
  } else if (num_dist_codes == 1) {
    d_lengths[d_lengths[0] ? 1 : 0] = 1;
  }
}